

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

clock_id_t __thiscall
tchecker::reference_clock_variables_t::declare_reference_clock
          (reference_clock_variables_t *this,string *name)

{
  uint uVar1;
  clock_id_t cVar2;
  size_t sVar3;
  runtime_error *this_00;
  
  uVar1 = this->_refcount;
  sVar3 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this);
  if (sVar3 != uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Reference clocks must be declared before clock variables");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar2 = declare(this,name,this->_refcount);
  if (cVar2 == this->_refcount) {
    this->_refcount = cVar2 + 1;
    return cVar2;
  }
  __assert_fail("id == _refcount",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                ,0x1e3,
                "tchecker::clock_id_t tchecker::reference_clock_variables_t::declare_reference_clock(const std::string &)"
               );
}

Assistant:

tchecker::clock_id_t reference_clock_variables_t::declare_reference_clock(std::string const & name)
{
  if (_refcount != size())
    throw std::runtime_error("Reference clocks must be declared before clock variables");

  tchecker::clock_id_t id = declare(name, _refcount);
  assert(id == _refcount);
  ++_refcount;

  return id;
}